

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bicubic_apply_interpolation_p1
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  undefined8 *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float _v;
  float x3_val;
  float x2_val;
  float x1_val;
  float x0_val;
  int ii;
  int *offset_ptr;
  float value_f [4];
  float y_coeffs3;
  float y_coeffs2;
  float y_coeffs1;
  float y_coeffs0;
  float x_coeffs3;
  float x_coeffs2;
  float x_coeffs1;
  float x_coeffs0;
  int x;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m;
  Mat *m_2;
  Mat *m_1;
  float local_400;
  float local_3fc;
  float local_3f8;
  float local_3f4;
  int local_364;
  float *local_360;
  float local_358 [5];
  float local_344;
  float local_340;
  float local_33c;
  float local_338;
  float local_334;
  float local_330;
  float local_32c;
  float local_328;
  int local_324;
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined4 local_308;
  undefined8 local_300;
  undefined4 local_2f8;
  undefined4 local_2f4;
  undefined4 local_2f0;
  undefined4 local_2ec;
  undefined4 local_2e8;
  undefined8 local_2e0;
  float *local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined4 local_2b8;
  long local_2b0;
  undefined4 local_2a8;
  undefined4 local_2a4;
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined8 local_290;
  float *local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 local_270;
  undefined4 local_268;
  long local_260;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined8 local_240;
  long local_238;
  int local_22c;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  undefined8 *local_210;
  long *local_208;
  long *local_200;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined8 *local_1e8;
  undefined8 *local_1d8;
  undefined8 *local_1c8;
  undefined8 *local_1b8;
  undefined1 local_195;
  int local_194;
  undefined8 *local_188;
  undefined8 *local_160;
  undefined1 local_155;
  undefined4 local_154;
  undefined8 *local_148;
  undefined1 local_11d;
  int local_11c;
  undefined8 *local_110;
  undefined8 *local_e8;
  long local_e0;
  undefined4 local_d4;
  long local_d0;
  float *local_c8;
  undefined4 local_bc;
  int local_b8;
  int local_b4;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined4 local_9c;
  long local_98;
  float *local_90;
  undefined4 local_84;
  int local_80;
  int local_7c;
  undefined8 *local_78;
  long local_70;
  undefined4 local_64;
  long local_60;
  long local_58;
  undefined4 local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  undefined4 local_34;
  long local_30;
  undefined4 local_24;
  long local_20;
  undefined4 local_14;
  long local_10;
  undefined8 *local_8;
  
  local_21c = (int)in_RSI[7];
  local_220 = *(int *)((long)in_RSI + 0x2c);
  local_224 = (int)in_RSI[6];
  local_228 = local_220 * local_224;
  local_210 = in_RDX;
  local_208 = in_RSI;
  local_200 = in_RDI;
  for (local_22c = 0; local_22c < local_21c; local_22c = local_22c + 1) {
    local_188 = &local_280;
    local_44 = *(int *)((long)local_200 + 0x2c);
    local_48 = (int)local_200[6];
    local_4c = *(undefined4 *)((long)local_200 + 0x34);
    local_238 = *local_200 + local_200[8] * (long)local_22c * local_200[2];
    local_60 = local_200[2];
    local_64 = (undefined4)local_200[3];
    local_70 = local_200[4];
    local_40 = &local_280;
    local_30 = (long)local_44 * (long)local_48 * local_60;
    local_160 = &local_280;
    local_1f8 = &local_280;
    local_110 = &local_2d0;
    local_b4 = *(int *)((long)local_208 + 0x2c);
    local_b8 = (int)local_208[6];
    local_bc = *(undefined4 *)((long)local_208 + 0x34);
    local_288 = (float *)(*local_208 + local_208[8] * (long)local_22c * local_208[2]);
    local_d0 = local_208[2];
    local_d4 = (undefined4)local_208[3];
    local_e0 = local_208[4];
    local_b0 = &local_2d0;
    local_10 = (long)local_b4 * (long)local_b8 * local_d0;
    local_e8 = &local_2d0;
    local_1f0 = &local_2d0;
    local_148 = &local_320;
    local_7c = *(int *)((long)local_210 + 0x2c);
    local_80 = *(int *)(local_210 + 6);
    local_84 = *(undefined4 *)((long)local_210 + 0x34);
    local_2d8 = (float *)*local_210;
    local_98 = local_210[2];
    local_9c = *(undefined4 *)(local_210 + 3);
    local_a8 = local_210[4];
    local_78 = &local_320;
    local_20 = (long)local_7c * (long)local_80 * local_98;
    local_8 = &local_320;
    local_1e8 = &local_320;
    local_248 = 0;
    local_24c = 0;
    local_250 = 0;
    local_254 = 0;
    local_268 = 0;
    local_270 = 0;
    local_278 = 0;
    local_280 = 0;
    local_298 = 0;
    local_29c = 0;
    local_2a0 = 0;
    local_2a4 = 0;
    local_2b8 = 0;
    local_2c0 = 0;
    local_2c8 = 0;
    local_2d0 = 0;
    local_14 = 0x10;
    local_24 = 0x10;
    local_34 = 0x10;
    local_11c = local_22c;
    local_11d = 1;
    local_154 = 0;
    local_155 = 1;
    local_194 = local_22c;
    local_195 = 1;
    local_240 = 0;
    local_258 = 0;
    local_290 = 0;
    local_2a8 = 0;
    local_320 = 0;
    local_310 = 0;
    local_308 = 0;
    local_2f8 = 0;
    local_2f4 = 0;
    local_2f0 = 0;
    local_2ec = 0;
    local_2e8 = 0;
    local_2e0 = 0;
    local_318 = 0;
    local_1d8 = local_1e8;
    local_1c8 = local_1f0;
    local_1b8 = local_1f8;
    local_c8 = local_288;
    local_90 = local_2d8;
    local_58 = local_238;
    local_300 = local_a8;
    local_2b0 = local_e0;
    local_260 = local_70;
    for (local_324 = 0; local_324 < local_228; local_324 = local_324 + 1) {
      cubic_interp1d(&local_328,&local_32c,&local_330,&local_334,*local_2d8);
      cubic_interp1d(&local_338,&local_33c,&local_340,&local_344,local_2d8[1]);
      local_360 = local_2d8 + 2;
      for (local_364 = 0; local_364 < 4; local_364 = local_364 + 1) {
        if ((int)*local_360 < 0) {
          local_3f4 = 0.0;
        }
        else {
          local_3f4 = *(float *)(local_238 + (long)(int)*local_360 * 4);
        }
        if ((int)local_360[1] < 0) {
          local_3f8 = 0.0;
        }
        else {
          local_3f8 = *(float *)(local_238 + (long)(int)local_360[1] * 4);
        }
        if ((int)local_360[2] < 0) {
          local_3fc = 0.0;
        }
        else {
          local_3fc = *(float *)(local_238 + (long)(int)local_360[2] * 4);
        }
        if ((int)local_360[3] < 0) {
          local_400 = 0.0;
        }
        else {
          local_400 = *(float *)(local_238 + (long)(int)local_360[3] * 4);
        }
        local_358[local_364] = local_328 * local_3f4;
        local_358[local_364] = local_32c * local_3f8 + local_358[local_364];
        local_358[local_364] = local_330 * local_3fc + local_358[local_364];
        local_358[local_364] = local_334 * local_400 + local_358[local_364];
        local_360 = local_360 + 4;
      }
      *local_288 = local_344 * local_358[3] +
                   local_340 * local_358[2] + local_33c * local_358[1] + local_338 * local_358[0];
      local_288 = local_288 + 1;
      local_2d8 = local_2d8 + 0x12;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bicubic_apply_interpolation_p1(const Mat& src, Mat& dst, Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int x = 0; x < grid_size; x++)
        {
            float x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3;
            float y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3;
            float value_f[4];
            cubic_interp1d(x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3, offset_value_ptr[0]);
            cubic_interp1d(y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3, offset_value_ptr[1]);

            const int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int ii = 0; ii < 4; ii++)
            {
                float x0_val = offset_ptr[0] >= 0 ? *(srcptr + offset_ptr[0]) : 0;
                float x1_val = offset_ptr[1] >= 0 ? *(srcptr + offset_ptr[1]) : 0;
                float x2_val = offset_ptr[2] >= 0 ? *(srcptr + offset_ptr[2]) : 0;
                float x3_val = offset_ptr[3] >= 0 ? *(srcptr + offset_ptr[3]) : 0;

                value_f[ii] = x_coeffs0 * x0_val;
                value_f[ii] = x_coeffs1 * x1_val + value_f[ii];
                value_f[ii] = x_coeffs2 * x2_val + value_f[ii];
                value_f[ii] = x_coeffs3 * x3_val + value_f[ii];

                offset_ptr += 4;
            }

            float _v = y_coeffs0 * value_f[0];
            _v = y_coeffs1 * value_f[1] + _v;
            _v = y_coeffs2 * value_f[2] + _v;
            _v = y_coeffs3 * value_f[3] + _v;
            *dstptr = _v;

            dstptr++;
            offset_value_ptr += 18;
        }
    }
}